

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ContrastiveLossParameter::Clear(ContrastiveLossParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    this->legacy_version_ = false;
    this->margin_ = 1.0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void ContrastiveLossParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ContrastiveLossParameter)
  if (_has_bits_[0 / 32] & 3u) {
    legacy_version_ = false;
    margin_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}